

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CLI11.hpp
# Opt level: O0

bool __thiscall CLI::Option::check_name(Option *this,string *name)

{
  ulong uVar1;
  char *pcVar2;
  string local_190;
  string local_170;
  string local_150;
  string local_130;
  string local_110;
  string local_f0;
  string local_d0;
  string local_b0;
  undefined1 local_90 [8];
  string local_pname;
  string local_40;
  string *local_20;
  string *name_local;
  Option *this_local;
  
  local_20 = name;
  name_local = (string *)this;
  uVar1 = ::std::__cxx11::string::length();
  if (2 < uVar1) {
    pcVar2 = (char *)::std::__cxx11::string::operator[]((ulong)name);
    if (*pcVar2 == '-') {
      pcVar2 = (char *)::std::__cxx11::string::operator[]((ulong)name);
      if (*pcVar2 == '-') {
        ::std::__cxx11::string::substr((ulong)&local_40,(ulong)name);
        this_local._7_1_ = check_lname(this,&local_40);
        ::std::__cxx11::string::~string((string *)&local_40);
        goto LAB_001b747b;
      }
    }
  }
  uVar1 = ::std::__cxx11::string::length();
  if (1 < uVar1) {
    pcVar2 = (char *)::std::__cxx11::string::front();
    if (*pcVar2 == '-') {
      ::std::__cxx11::string::substr
                ((ulong)(&local_pname.field_2._M_allocated_capacity + 1),(ulong)name);
      this_local._7_1_ =
           check_sname(this,(string *)(&local_pname.field_2._M_allocated_capacity + 1));
      ::std::__cxx11::string::~string((string *)(local_pname.field_2._M_local_buf + 8));
      goto LAB_001b747b;
    }
  }
  ::std::__cxx11::string::string((string *)local_90,(string *)&this->pname_);
  if (((this->super_OptionBase<CLI::Option>).ignore_underscore_ & 1U) != 0) {
    ::std::__cxx11::string::string((string *)&local_d0,(string *)local_90);
    detail::remove_underscore(&local_b0,&local_d0);
    ::std::__cxx11::string::operator=((string *)local_90,(string *)&local_b0);
    ::std::__cxx11::string::~string((string *)&local_b0);
    ::std::__cxx11::string::~string((string *)&local_d0);
    ::std::__cxx11::string::string((string *)&local_110,(string *)name);
    detail::remove_underscore(&local_f0,&local_110);
    ::std::__cxx11::string::operator=((string *)name,(string *)&local_f0);
    ::std::__cxx11::string::~string((string *)&local_f0);
    ::std::__cxx11::string::~string((string *)&local_110);
  }
  if (((this->super_OptionBase<CLI::Option>).ignore_case_ & 1U) != 0) {
    ::std::__cxx11::string::string((string *)&local_150,(string *)local_90);
    detail::to_lower(&local_130,&local_150);
    ::std::__cxx11::string::operator=((string *)local_90,(string *)&local_130);
    ::std::__cxx11::string::~string((string *)&local_130);
    ::std::__cxx11::string::~string((string *)&local_150);
    ::std::__cxx11::string::string((string *)&local_190,(string *)name);
    detail::to_lower(&local_170,&local_190);
    ::std::__cxx11::string::operator=((string *)name,(string *)&local_170);
    ::std::__cxx11::string::~string((string *)&local_170);
    ::std::__cxx11::string::~string((string *)&local_190);
  }
  this_local._7_1_ =
       ::std::operator==(name,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              local_90);
  ::std::__cxx11::string::~string((string *)local_90);
LAB_001b747b:
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

bool check_name(std::string name) const {

        if(name.length() > 2 && name[0] == '-' && name[1] == '-')
            return check_lname(name.substr(2));
        else if(name.length() > 1 && name.front() == '-')
            return check_sname(name.substr(1));
        else {
            std::string local_pname = pname_;
            if(ignore_underscore_) {
                local_pname = detail::remove_underscore(local_pname);
                name = detail::remove_underscore(name);
            }
            if(ignore_case_) {
                local_pname = detail::to_lower(local_pname);
                name = detail::to_lower(name);
            }
            return name == local_pname;
        }
    }